

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDsd.c
# Opt level: O2

int If_DsdManPushInv_rec(If_DsdMan_t *p,int iLit,uchar *pPerm)

{
  Vec_Ptr_t *p_00;
  int iVar1;
  uint uVar2;
  If_DsdObj_t *pObj;
  uint uVar3;
  
  p_00 = &p->vObjs;
  do {
    while( true ) {
      iVar1 = Abc_Lit2Var(iLit);
      pObj = (If_DsdObj_t *)Vec_PtrEntry(p_00,iVar1);
      uVar2 = *(uint *)&pObj->field_0x4;
      uVar3 = uVar2 & 7;
      if (uVar3 == 4) break;
      if (uVar3 != 5) {
        if (uVar3 == 2) {
          iVar1 = Abc_LitNot((uint)*pPerm);
          *pPerm = (byte)iVar1;
          return 1;
        }
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDsd.c"
                      ,0x5d5,"int If_DsdManPushInv_rec(If_DsdMan_t *, int, unsigned char *)");
      }
      iVar1 = If_DsdManCheckInv_rec(p,*(int *)&pObj[1].field_0x4);
      if ((iVar1 == 0) || (iVar1 = If_DsdManCheckInv_rec(p,pObj[2].Id), iVar1 == 0)) {
        __assert_fail("If_DsdManCheckInv_rec(p, pObj->pFans[1]) && If_DsdManCheckInv_rec(p, pObj->pFans[2])"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDsd.c"
                      ,0x5cf,"int If_DsdManPushInv_rec(If_DsdMan_t *, int, unsigned char *)");
      }
      uVar2 = If_DsdVecLitSuppSize(p_00,pObj[1].Id);
      If_DsdManPushInv_rec(p,*(int *)&pObj[1].field_0x4,pPerm + uVar2);
      uVar3 = If_DsdVecLitSuppSize(p_00,*(int *)&pObj[1].field_0x4);
      pPerm = pPerm + uVar2 + uVar3;
      iLit = pObj[2].Id;
    }
    uVar3 = 0;
    while( true ) {
      if (uVar2 >> 0x1b <= uVar3) {
        return 1;
      }
      iLit = If_DsdObjFaninLit(pObj,uVar3);
      if (iLit == 0) {
        return 1;
      }
      iVar1 = If_DsdManCheckInv_rec(p,iLit);
      if (iVar1 != 0) break;
      uVar2 = If_DsdVecLitSuppSize(p_00,iLit);
      pPerm = pPerm + uVar2;
      uVar3 = uVar3 + 1;
      uVar2 = *(uint *)&pObj->field_0x4;
    }
  } while( true );
}

Assistant:

int If_DsdManPushInv_rec( If_DsdMan_t * p, int iLit, unsigned char * pPerm )
{
    If_DsdObj_t * pObj;
    int i, iFanin;
    pObj = If_DsdVecObj( &p->vObjs, Abc_Lit2Var(iLit) );
    if ( If_DsdObjType(pObj) == IF_DSD_VAR )
        pPerm[0] = (unsigned char)Abc_LitNot((int)pPerm[0]);
    else if ( If_DsdObjType(pObj) == IF_DSD_XOR )
    {
        If_DsdObjForEachFaninLit( &p->vObjs, pObj, iFanin, i )
        {
            if ( If_DsdManCheckInv_rec(p, iFanin) )
            {
                If_DsdManPushInv_rec( p, iFanin, pPerm );
                break;
            }
            pPerm += If_DsdVecLitSuppSize(&p->vObjs, iFanin);
        }
    }
    else if ( If_DsdObjType(pObj) == IF_DSD_MUX )
    {
        assert( If_DsdManCheckInv_rec(p, pObj->pFans[1]) && If_DsdManCheckInv_rec(p, pObj->pFans[2]) );
        pPerm += If_DsdVecLitSuppSize(&p->vObjs, pObj->pFans[0]);
        If_DsdManPushInv_rec(p, pObj->pFans[1], pPerm);
        pPerm += If_DsdVecLitSuppSize(&p->vObjs, pObj->pFans[1]);
        If_DsdManPushInv_rec(p, pObj->pFans[2], pPerm);
    }
    else assert( 0 );
    return 1;
}